

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceBlock
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  allocator<char> local_51;
  string local_50;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *service_location_local;
  ServiceDescriptorProto *service_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)service_location;
  service_location_local = (LocationRecorder *)service;
  service_local = (ServiceDescriptorProto *)this;
  bVar1 = ConsumeEndOfDeclaration(this,"{",service_location);
  if (bVar1) {
    while (bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = AtEnd(this);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Reached end of input in service definition (missing \'}\')."
                   ,&local_51);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator(&local_51);
        return false;
      }
      bVar1 = ParseServiceStatement
                        (this,(ServiceDescriptorProto *)service_location_local,
                         (LocationRecorder *)containing_file_local,local_30);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseServiceBlock(ServiceDescriptorProto* service,
                               const LocationRecorder& service_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &service_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in service definition (missing '}').");
      return false;
    }

    if (!ParseServiceStatement(service, service_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}